

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::setDesiredReducedJointConfiguration
          (InverseKinematics *this,Span<const_double,__1L> desiredJointConfiguration,
          Span<const_double,__1L> weights)

{
  bool bVar1;
  
  bVar1 = missingIpoptErrorReport();
  return bVar1;
}

Assistant:

bool InverseKinematics::setDesiredReducedJointConfiguration(iDynTree::Span<const double> desiredJointConfiguration,
                                                                iDynTree::Span<const double> weights)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        assert(IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints.size() == desiredJointConfiguration.size());

        if (desiredJointConfiguration.size() != weights.size()){
            reportError("InverseKinematics", "setDesiredFullJointsConfiguration", "The dimension of the desired weights is different from the desiredJointConfiguration size.");
            return false;
        }

        for (size_t i = 0; i < desiredJointConfiguration.size(); ++i) {
            IK_PIMPL(m_pimpl)->m_preferredJointsConfiguration(IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints[i]) = desiredJointConfiguration[i];
            if (weights(i) >= 0.0) {
                IK_PIMPL(m_pimpl)->m_preferredJointsWeight(IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints[i]) = weights[i];
            }
        }

        return true;
#else
        return missingIpoptErrorReport();
#endif
    }